

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O2

void __thiscall AtomicFile::impl::finalize(impl *this)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  string *__return_storage_ptr__;
  allocator<char> local_109;
  string local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->is_temp_active == true) && (allow_atomics)) {
    bVar3 = Path::exists(&(this->temp_file).super_Path);
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Moving \'{1}\' -> \'{2}\'",&local_109);
      psVar1 = &(this->temp_file).super_Path._data;
      std::__cxx11::string::string((string *)&local_88,(string *)psVar1);
      psVar2 = &(this->real_file).super_Path._data;
      std::__cxx11::string::string((string *)&local_a8,(string *)psVar2);
      format<std::__cxx11::string,std::__cxx11::string>(&local_108,&local_e8,&local_88,&local_a8);
      debug(&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_e8);
      iVar4 = rename((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p);
      if (iVar4 != 0) {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,
                   "Failed copying \'{1}\' to \'{2}\'. Database corruption possible.",
                   (allocator<char> *)&local_e8);
        std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
        std::__cxx11::string::string((string *)&local_68,(string *)psVar2);
        format<std::__cxx11::string,std::__cxx11::string>
                  (__return_storage_ptr__,&local_108,&local_48,&local_68);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"Removing \'{1}\'",&local_109);
      psVar1 = &(this->real_file).super_Path._data;
      std::__cxx11::string::string((string *)&local_c8,(string *)psVar1);
      format<std::__cxx11::string>(&local_108,&local_e8,&local_c8);
      debug(&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_e8);
      ::remove((psVar1->_M_dataplus)._M_p);
    }
    this->is_temp_active = false;
  }
  return;
}

Assistant:

void AtomicFile::impl::finalize ()
{
  if (is_temp_active && impl::allow_atomics)
  {
    if (temp_file.exists ())
    {
      debug (format ("Moving '{1}' -> '{2}'", temp_file._data, real_file._data));
      if (std::rename (temp_file._data.c_str (), real_file._data.c_str ()))
      {
        throw format("Failed copying '{1}' to '{2}'. Database corruption possible.",
            temp_file._data, real_file._data);
      }
    }
    else
    {
      debug (format ("Removing '{1}'", real_file._data));
      std::remove (real_file._data.c_str ());
    }
    is_temp_active = false;
  }
}